

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O1

void __thiscall
spdlog::logger::log_<int,int,int>
          (logger *this,source_loc loc,level_enum lvl,string_view_t fmt,int *args,int *args_1,
          int *args_2)

{
  int iVar1;
  string_view_t a_logger_name;
  string_view_t msg;
  bool traceback_enabled;
  format_args args_00;
  memory_buf_t buf;
  log_msg log_msg;
  buffer<char> local_1b8;
  char local_198 [256];
  log_msg local_98;
  
  iVar1 = (this->level_).super___atomic_base<int>._M_i;
  traceback_enabled = details::backtracer::enabled(&this->tracer_);
  if (iVar1 <= (int)lvl || traceback_enabled) {
    local_1b8.ptr_ = local_198;
    local_1b8.size_ = 0;
    local_1b8.grow_ =
         ::fmt::v11::basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_>::grow;
    local_1b8.capacity_ = 0xfa;
    local_98.logger_name.data_._0_4_ = *args;
    local_98.level = *args_1;
    local_98.thread_id._0_4_ = *args_2;
    args_00.field_1.values_ = (value<fmt::v11::context> *)&local_98;
    args_00.desc_ = 0x111;
    ::fmt::v11::detail::vformat_to(&local_1b8,fmt,args_00,(locale_ref)0x0);
    a_logger_name.data_ = (this->name_)._M_dataplus._M_p;
    a_logger_name.size_ = (this->name_)._M_string_length;
    msg.size_ = local_1b8.size_;
    msg.data_ = local_1b8.ptr_;
    details::log_msg::log_msg(&local_98,loc,a_logger_name,lvl,msg);
    log_it_(this,&local_98,iVar1 <= (int)lvl,traceback_enabled);
    if (local_1b8.ptr_ != local_198) {
      free(local_1b8.ptr_);
    }
  }
  return;
}

Assistant:

void log_(source_loc loc, level::level_enum lvl, string_view_t fmt, Args &&...args) {
        bool log_enabled = should_log(lvl);
        bool traceback_enabled = tracer_.enabled();
        if (!log_enabled && !traceback_enabled) {
            return;
        }
        SPDLOG_TRY {
            memory_buf_t buf;
#ifdef SPDLOG_USE_STD_FORMAT
            fmt_lib::vformat_to(std::back_inserter(buf), fmt, fmt_lib::make_format_args(args...));
#else
            fmt::vformat_to(fmt::appender(buf), fmt, fmt::make_format_args(args...));
#endif

            details::log_msg log_msg(loc, name_, lvl, string_view_t(buf.data(), buf.size()));
            log_it_(log_msg, log_enabled, traceback_enabled);
        }